

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O0

void __thiscall Kss_Emu::update_eq(Kss_Emu *this,blip_eq_t *eq)

{
  Sms_Apu *in_RSI;
  blip_eq_t *in_RDI;
  
  Ay_Apu::treble_eq((Ay_Apu *)in_RSI,in_RDI);
  Scc_Apu::treble_eq((Scc_Apu *)in_RSI,in_RDI);
  if (in_RDI[0x873].treble != 0.0) {
    Sms_Apu::treble_eq(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void Kss_Emu::update_eq( blip_eq_t const& eq )
{
	ay.treble_eq( eq );
	scc.treble_eq( eq );
	if ( sn )
		sn->treble_eq( eq );
}